

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  if (argc < 2) {
    usageMessage((ostream *)&std::cerr,*argv,false);
    iVar1 = -1;
  }
  else {
    bVar6 = true;
    uVar4 = 2;
    do {
      pcVar2 = argv[uVar4 - 1];
      iVar1 = strcmp(pcVar2,"-h");
      if ((iVar1 == 0) || (iVar1 = strcmp(argv[1],"--help"), iVar1 == 0)) {
        usageMessage((ostream *)&std::cout,"exrheader",true);
LAB_00104f11:
        if (bVar6) goto LAB_00104f3f;
        break;
      }
      iVar1 = strcmp(pcVar2,"--version");
      if (iVar1 == 0) {
        pcVar2 = (char *)Imf_3_2::getLibraryVersion();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"exrheader (OpenEXR) ",0x14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"3.2.0",5);
        iVar1 = strcmp(pcVar2,"3.2.0");
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"(OpenEXR version ",0x11);
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x109158);
          }
          else {
            sVar3 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," https://openexr.com",0x14);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Copyright (c) Contributors to the OpenEXR Project",0x31);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"License BSD-3-Clause",0x14);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
        goto LAB_00104f11;
      }
      bVar6 = uVar4 < (uint)argc;
      bVar7 = uVar4 != (uint)argc;
      uVar4 = uVar4 + 1;
    } while (bVar7);
    uVar4 = 2;
    if (2 < argc) {
      uVar4 = (ulong)(uint)argc;
    }
    uVar5 = 1;
    do {
      printInfo(argv[uVar5]);
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
LAB_00104f3f:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
main (int argc, char** argv)
{
    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    for (int i = 1; i < argc; ++i)
    {
        if (!strcmp (argv[i], "-h") || !strcmp(argv[1], "--help"))
        {
            usageMessage (cout, "exrheader", true);
            return 0;
        }
        else if (!strcmp (argv[i], "--version"))
        {
            const char* libraryVersion = getLibraryVersion();
            
            cout << "exrheader (OpenEXR) " << OPENEXR_VERSION_STRING;
            if (strcmp(libraryVersion, OPENEXR_VERSION_STRING))
                cout << "(OpenEXR version " << libraryVersion << ")";
            cout << " https://openexr.com" << endl;
            cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
            cout << "License BSD-3-Clause" << endl;
            return 0;
        }
    }

    try
    {
        for (int i = 1; i < argc; ++i)
            printInfo (argv[i]);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }

    return 0;
}